

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobjectcleanuphandler.cpp
# Opt level: O1

int __thiscall QObjectCleanupHandler::remove(QObjectCleanupHandler *this,char *__filename)

{
  long lVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  long in_RAX;
  undefined7 extraout_var;
  long lVar5;
  
  if (*(long *)(this + 0x20) != 0) {
    lVar5 = -8;
    do {
      iVar4 = (int)in_RAX;
      lVar1 = *(long *)(this + 0x20) * -8 + lVar5;
      if (lVar1 == -8) goto LAB_002c277d;
      in_RAX = lVar5 + 8;
      plVar2 = (long *)(*(long *)(this + 0x18) + 8 + lVar5);
      lVar5 = in_RAX;
    } while ((char *)*plVar2 != __filename);
    iVar4 = (int)(in_RAX >> 3);
LAB_002c277d:
    if (lVar1 != -8) goto LAB_002c278a;
  }
  iVar4 = -1;
LAB_002c278a:
  if (iVar4 == -1) {
    return -1;
  }
  QList<QObject_*>::removeAt((QList<QObject_*> *)(this + 0x10),(long)iVar4);
  bVar3 = QObject::disconnect((QObject *)__filename,"2destroyed(QObject*)",(QObject *)this,
                              "1objectDestroyed(QObject*)");
  return (int)CONCAT71(extraout_var,bVar3);
}

Assistant:

void QObjectCleanupHandler::remove(QObject *object)
{
    int index;
    if ((index = cleanupObjects.indexOf(object)) != -1) {
        cleanupObjects.removeAt(index);
        disconnect(object, SIGNAL(destroyed(QObject*)), this, SLOT(objectDestroyed(QObject*)));
    }
}